

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraylist.cpp
# Opt level: O2

QByteArray *
QtPrivate::QByteArrayList_join
          (QByteArray *__return_storage_ptr__,QByteArrayList *that,char *sep,qsizetype seplen)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar4 = (that->d).size;
  lVar1 = 0x10;
  lVar3 = 0;
  lVar2 = lVar4;
  while (bVar5 = lVar2 != 0, lVar2 = lVar2 + -1, bVar5) {
    lVar3 = lVar3 + *(long *)((long)&(((that->d).ptr)->d).d + lVar1);
    lVar1 = lVar1 + 0x18;
  }
  lVar1 = 0;
  if (lVar4 != 0) {
    lVar1 = (lVar4 + -1) * seplen;
  }
  if (lVar3 + lVar1 != 0) {
    QByteArray::reserve(__return_storage_ptr__,lVar3 + lVar1);
    lVar4 = (that->d).size;
  }
  lVar1 = 0;
  while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
    if (lVar1 != 0) {
      QByteArray::append(__return_storage_ptr__,sep,seplen);
    }
    QByteArray::append(__return_storage_ptr__,(QByteArray *)((long)&(((that->d).ptr)->d).d + lVar1))
    ;
    lVar1 = lVar1 + 0x18;
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QtPrivate::QByteArrayList_join(const QByteArrayList *that, const char *sep, qsizetype seplen)
{
    QByteArray res;
    if (const qsizetype joinedSize = QByteArrayList_joinedSize(that, seplen))
        res.reserve(joinedSize); // don't call reserve(0) - it allocates one byte for the NUL
    const qsizetype size = that->size();
    for (qsizetype i = 0; i < size; ++i) {
        if (i)
            res.append(sep, seplen);
        res += that->at(i);
    }
    return res;
}